

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void address_space_init_ppc64(uc_struct_conflict11 *uc,AddressSpace *as,MemoryRegion *root)

{
  QTailQLink *pQVar1;
  MemoryRegion *mr;
  gpointer pvVar2;
  
  as->uc = (uc_struct_conflict12 *)uc;
  as->root = (MemoryRegion_conflict *)root;
  as->current_map = (FlatView *)0x0;
  (as->listeners).tqh_first = (MemoryListener *)0x0;
  (as->listeners).tqh_circ.tql_prev = (QTailQLink *)&as->listeners;
  (as->address_spaces_link).tqe_next = (AddressSpace *)0x0;
  pQVar1 = (uc->address_spaces).tqh_circ.tql_prev;
  (as->address_spaces_link).tqe_circ.tql_prev = pQVar1;
  pQVar1->tql_next = as;
  (uc->address_spaces).tqh_circ.tql_prev = (QTailQLink *)&as->address_spaces_link;
  mr = memory_region_get_flatview_root((MemoryRegion *)as->root);
  flatviews_init((uc_struct_conflict11 *)as->uc);
  pvVar2 = g_hash_table_lookup(as->uc->flat_views,mr);
  if (pvVar2 == (gpointer)0x0) {
    generate_memory_topology((uc_struct_conflict11 *)as->uc,mr);
  }
  address_space_set_flatview(as);
  return;
}

Assistant:

void address_space_init(struct uc_struct *uc,
                        AddressSpace *as,
                        MemoryRegion *root)
{
    as->uc = uc;
    as->root = root;
    as->current_map = NULL;
    QTAILQ_INIT(&as->listeners);
    QTAILQ_INSERT_TAIL(&uc->address_spaces, as, address_spaces_link);
    address_space_update_topology(as);
}